

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferGLImpl.cpp
# Opt level: O2

SparseBufferProperties __thiscall Diligent::BufferGLImpl::GetSparseProperties(BufferGLImpl *this)

{
  string msg;
  string local_28;
  
  FormatString<char[58]>
            (&local_28,(char (*) [58])"IBuffer::GetSparseProperties() is not supported in OpenGL");
  DebugAssertionFailed
            (local_28._M_dataplus._M_p,"GetSparseProperties",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/BufferGLImpl.cpp"
             ,0x1b1);
  std::__cxx11::string::~string((string *)&local_28);
  return (SparseBufferProperties)ZEXT816(0);
}

Assistant:

SparseBufferProperties BufferGLImpl::GetSparseProperties() const
{
    DEV_ERROR("IBuffer::GetSparseProperties() is not supported in OpenGL");
    return {};
}